

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O2

int PUSH_NEXT(xmlNodePtr *dst,size_t size,TEMP_STORAGE_T *store,size_t minrun,
             TIM_SORT_RUN_T *run_stack,size_t *stack_curr,size_t *curr)

{
  xmlNodePtr y;
  xmlNodePtr pxVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t start;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar6 = *curr;
  uVar5 = size - uVar6;
  if (uVar5 == 1) {
    start = 1;
  }
  else if (uVar6 < size - 2) {
    iVar3 = wrap_cmp(dst[uVar6],dst[uVar6 + 1]);
    uVar8 = size - 1;
    uVar7 = uVar6;
    if (iVar3 < 1) {
      for (; size - 3 != uVar7; uVar7 = uVar7 + 1) {
        iVar3 = wrap_cmp(dst[uVar7 + 1],dst[uVar7 + 2]);
        if (0 < iVar3) {
          uVar8 = uVar7 + 2;
          break;
        }
      }
      start = uVar8 - uVar6;
    }
    else {
      for (; uVar4 = uVar6, uVar9 = uVar8, size - 3 != uVar7; uVar7 = uVar7 + 1) {
        iVar3 = wrap_cmp(dst[uVar7 + 1],dst[uVar7 + 2]);
        if (iVar3 < 1) {
          uVar8 = uVar7 + 2;
          uVar9 = uVar8;
          break;
        }
      }
      for (; uVar8 = uVar8 - 1, uVar4 < uVar8; uVar4 = uVar4 + 1) {
        pxVar1 = dst[uVar4];
        dst[uVar4] = dst[uVar8];
        dst[uVar8] = pxVar1;
      }
      start = uVar9 - uVar6;
    }
  }
  else {
    pxVar1 = dst[size - 2];
    y = dst[size - 1];
    iVar3 = wrap_cmp(pxVar1,y);
    start = 2;
    if (0 < iVar3) {
      dst[size - 2] = y;
      dst[size - 1] = pxVar1;
    }
  }
  if (uVar5 < minrun) {
    minrun = uVar5;
  }
  if (start < minrun) {
    libxml_domnode_binary_insertion_sort_start(dst + uVar6,start,minrun);
    uVar6 = *curr;
    start = minrun;
  }
  run_stack[*stack_curr].start = uVar6;
  run_stack[*stack_curr].length = start;
  *stack_curr = *stack_curr + 1;
  sVar2 = *curr;
  *curr = start + sVar2;
  if (start + sVar2 == size) {
    uVar6 = *stack_curr;
    while (1 < uVar6) {
      libxml_domnode_tim_sort_merge(dst,run_stack,(int)uVar6,store);
      run_stack[*stack_curr - 2].length =
           run_stack[*stack_curr - 2].length + run_stack[*stack_curr - 1].length;
      uVar6 = *stack_curr - 1;
      *stack_curr = uVar6;
    }
    iVar3 = 0;
    if (store->storage != (xmlNodePtr *)0x0) {
      free(store->storage);
      store->storage = (xmlNodePtr *)0x0;
    }
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static __inline int PUSH_NEXT(SORT_TYPE *dst,
                              const size_t size,
                              TEMP_STORAGE_T *store,
                              const size_t minrun,
                              TIM_SORT_RUN_T *run_stack,
                              size_t *stack_curr,
                              size_t *curr) {
  size_t len = COUNT_RUN(dst, *curr, size);
  size_t run = minrun;

  if (run > size - *curr) {
    run = size - *curr;
  }

  if (run > len) {
    BINARY_INSERTION_SORT_START(&dst[*curr], len, run);
    len = run;
  }

  run_stack[*stack_curr].start = *curr;
  run_stack[*stack_curr].length = len;
  (*stack_curr)++;
  *curr += len;

  if (*curr == size) {
    /* finish up */
    while (*stack_curr > 1) {
      TIM_SORT_MERGE(dst, run_stack, *stack_curr, store);
      run_stack[*stack_curr - 2].length += run_stack[*stack_curr - 1].length;
      (*stack_curr)--;
    }

    if (store->storage != NULL) {
      free(store->storage);
      store->storage = NULL;
    }

    return 0;
  }

  return 1;
}